

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

nodeclass * LockModules(nodecontext *p,nodeclass *Class)

{
  size_t *psVar1;
  char cVar2;
  fourcc_t ClassId;
  nodecontext *Module;
  nodeclass *pnVar3;
  bool_t bVar4;
  
  ClassId = *(fourcc_t *)&Class[1].Meta;
  Module = (nodecontext *)Class->Module;
  if (Class->ParentClass == (nodeclass *)0x0) {
    if (Class->ParentId != 0) {
      return (nodeclass *)0x0;
    }
  }
  else {
    cVar2 = Class->State;
    pnVar3 = LockModules(p,Class->ParentClass);
    if ((pnVar3 != (nodeclass *)0x0) && (cVar2 < '\x01')) {
      Class = FindModuleClass(p,ClassId,(nodemodule *)Module);
    }
    if (pnVar3 == (nodeclass *)0x0) {
      return (nodeclass *)0x0;
    }
  }
  psVar1 = &(Module->Base).Base.RefCount;
  *psVar1 = *psVar1 + 1;
  if ((((Module != p) && (p->LoadModule != (_func_bool_t_nodecontext_ptr_nodemodule_ptr *)0x0)) &&
      ((Module->Base).Module == (void *)0x0)) &&
     (bVar4 = (*p->LoadModule)(p,(nodemodule *)Module), bVar4 != 0)) {
    NodeSingletonEvent(p,8,(nodemodule *)Module);
    Class = FindModuleClass(p,ClassId,(nodemodule *)Module);
  }
  if (Class->State < '\x01') {
    UnlockModules(Class);
    return (nodeclass *)0x0;
  }
  return Class;
}

Assistant:

static NOINLINE const nodeclass* LockModules(nodecontext* p, const nodeclass* Class)
{
    fourcc_t ClassId = NodeClass_ClassId(Class);
    nodemodule* Module = Class->Module;

    if (!Class->ParentClass)
    {
        if (Class->ParentId)
            return NULL;
    }
    else
    {
        int8_t State = Class->State;

        if (!LockModules(p,Class->ParentClass))
            return NULL;

        if (State<CLASS_INITED)
            Class = FindModuleClass(p,ClassId,Module); // maybe have been reallocated
    }

    AddClassRef(Class);
    ++Module->Base.RefCount;

    if (CheckLoadModule(p,Module))
    {
        NodeSingletonEvent(p,NODE_SINGLETON_STARTUP,Module);
        Class = FindModuleClass(p,ClassId,Module); // maybe have been reallocated
    }

    if (Class->State<CLASS_INITED)
    {
        UnlockModules(Class);
        return NULL;
    }

    return Class;
}